

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  uint uVar1;
  ImGuiTabItem *pIVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ImGuiTabItem *__src;
  float fVar6;
  float fVar7;
  ImGuiID IVar8;
  ImGuiTabItemFlags IVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ImGuiTabItem *pIVar13;
  int iVar14;
  long lVar15;
  ImGuiTabItem *__dest;
  uint uVar16;
  ImGuiTabItem item_tmp;
  undefined3 uStack_1b;
  undefined5 uStack_18;
  
  if (tab_bar->ReorderRequestTabId == 0) {
    return false;
  }
  uVar1 = (tab_bar->Tabs).Size;
  if (0 < (long)(int)uVar1) {
    pIVar2 = (tab_bar->Tabs).Data;
    lVar15 = 0;
    pIVar13 = pIVar2;
    do {
      if (pIVar13->ID == tab_bar->ReorderRequestTabId) {
        if ((pIVar13->Flags & 0x20U) != 0) {
          return false;
        }
        iVar14 = (int)tab_bar->ReorderRequestOffset;
        uVar16 = iVar14 - (int)lVar15;
        if (uVar1 <= uVar16) {
          return false;
        }
        if ((pIVar2[uVar16].Flags & 0x20U) != 0) {
          return false;
        }
        if (((pIVar2[uVar16].Flags ^ pIVar13->Flags) & 0xc0U) != 0) {
          return false;
        }
        pIVar2 = pIVar2 + uVar16;
        uVar3._0_2_ = pIVar13->BeginOrder;
        uVar3._2_2_ = pIVar13->IndexDuringLayout;
        uVar3._4_1_ = pIVar13->WantClose;
        uVar3._5_3_ = *(undefined3 *)&pIVar13->field_0x25;
        uStack_18 = (undefined5)uVar3;
        IVar8 = pIVar13->ID;
        IVar9 = pIVar13->Flags;
        iVar10 = pIVar13->LastFrameVisible;
        iVar11 = pIVar13->LastFrameSelected;
        fVar6 = pIVar13->Offset;
        fVar7 = pIVar13->Width;
        uVar4 = pIVar13->ContentWidth;
        uVar5 = pIVar13->NameOffset;
        uStack_1b = (undefined3)((uint)uVar5 >> 8);
        __dest = pIVar2 + 1;
        __src = pIVar2;
        if (0 < tab_bar->ReorderRequestOffset) {
          __dest = pIVar13;
          __src = pIVar13 + 1;
        }
        iVar12 = -iVar14;
        if (0 < iVar14) {
          iVar12 = iVar14;
        }
        memmove(__dest,__src,(ulong)(uint)(iVar12 << 3) * 5);
        *(ulong *)((long)&pIVar2->NameOffset + 1) = CONCAT53(uStack_18,uStack_1b);
        pIVar2->Offset = fVar6;
        pIVar2->Width = fVar7;
        pIVar2->ContentWidth = (float)uVar4;
        pIVar2->NameOffset = uVar5;
        pIVar2->ID = IVar8;
        pIVar2->Flags = IVar9;
        pIVar2->LastFrameVisible = iVar10;
        pIVar2->LastFrameSelected = iVar11;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
      lVar15 = lVar15 + -1;
      pIVar13 = pIVar13 + 1;
    } while (-lVar15 != (long)(int)uVar1);
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestOffset;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered tabs must share the same section
    // (Note: TabBarQueueReorderFromMousePos() also has a similar test but since we allow direct calls to TabBarQueueReorder() we do it here too)
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & ImGuiTabItemFlags_SectionMask_) != (tab2->Flags & ImGuiTabItemFlags_SectionMask_))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    ImGuiTabItem* src_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 + 1 : tab2;
    ImGuiTabItem* dst_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 : tab2 + 1;
    const int move_count = (tab_bar->ReorderRequestOffset > 0) ? tab_bar->ReorderRequestOffset : -tab_bar->ReorderRequestOffset;
    memmove(dst_tab, src_tab, move_count * sizeof(ImGuiTabItem));
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}